

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::UninterpretedOption::_InternalParse
          (UninterpretedOption *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  UninterpretedOption_NamePart *msg;
  uint64 uVar2;
  string *s;
  char cVar3;
  uint uVar4;
  uint32 tag;
  double *local_48;
  uint local_3c;
  InternalMetadataWithArena *local_38;
  
  local_38 = &this->_internal_metadata_;
  uVar4 = 0;
  local_48 = (double *)ptr;
LAB_002c24a7:
  do {
    bVar1 = internal::ParseContext::Done(ctx,(char **)&local_48);
    if (bVar1) goto LAB_002c2612;
    local_48 = (double *)internal::ReadTag((char *)local_48,&local_3c,0);
    if (local_48 == (double *)0x0) goto LAB_002c260a;
    cVar3 = (char)local_3c;
    switch(local_3c >> 3) {
    case 2:
      if (cVar3 == '\x12') {
        local_48 = (double *)((long)local_48 + -1);
        do {
          local_48 = (double *)((long)local_48 + 1);
          msg = RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::Add(&this->name_);
          local_48 = (double *)
                     internal::ParseContext::
                     ParseMessage<google::protobuf::UninterpretedOption_NamePart>
                               (ctx,msg,(char *)local_48);
          if (local_48 == (double *)0x0) goto LAB_002c260a;
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(char *)local_48 == '\x12'));
        goto LAB_002c24a7;
      }
      break;
    case 3:
      if (cVar3 != '\x1a') break;
      s = _internal_mutable_identifier_value_abi_cxx11_(this);
LAB_002c25ce:
      local_48 = (double *)internal::InlineGreedyStringParser(s,(char *)local_48,ctx);
      goto joined_r0x002c2598;
    case 4:
      if (cVar3 == ' ') {
        uVar4 = uVar4 | 8;
        uVar2 = internal::ReadVarint((char **)&local_48);
        this->positive_int_value_ = uVar2;
        goto joined_r0x002c2598;
      }
      break;
    case 5:
      if (cVar3 == '(') {
        uVar4 = uVar4 | 0x10;
        uVar2 = internal::ReadVarint((char **)&local_48);
        this->negative_int_value_ = uVar2;
        goto joined_r0x002c2598;
      }
      break;
    case 6:
      if (cVar3 == '1') {
        uVar4 = uVar4 | 0x20;
        this->double_value_ = *local_48;
        local_48 = local_48 + 1;
        goto LAB_002c24a7;
      }
      break;
    case 7:
      if (cVar3 == ':') {
        s = _internal_mutable_string_value_abi_cxx11_(this);
        goto LAB_002c25ce;
      }
      break;
    case 8:
      if (cVar3 == 'B') {
        s = _internal_mutable_aggregate_value_abi_cxx11_(this);
        goto LAB_002c25ce;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      goto LAB_002c2612;
    }
    local_48 = (double *)internal::UnknownFieldParse(local_3c,local_38,(char *)local_48,ctx);
joined_r0x002c2598:
    if (local_48 == (double *)0x0) {
LAB_002c260a:
      local_48 = (double *)0x0;
LAB_002c2612:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
      return (char *)local_48;
    }
  } while( true );
}

Assistant:

const char* UninterpretedOption::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_name(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string identifier_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_identifier_value(), ptr, ctx, "google.protobuf.UninterpretedOption.identifier_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 positive_int_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_positive_int_value(&has_bits);
          positive_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int64 negative_int_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_negative_int_value(&has_bits);
          negative_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional double double_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 49)) {
          _Internal::set_has_double_value(&has_bits);
          double_value_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // optional bytes string_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(_internal_mutable_string_value(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string aggregate_value = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_aggregate_value(), ptr, ctx, "google.protobuf.UninterpretedOption.aggregate_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}